

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O0

contract_version *
cppwinrt::decode_contract_version_attribute
          (contract_version *__return_storage_ptr__,CustomAttribute *attribute)

{
  uint uVar1;
  size_type sVar2;
  cppwinrt *this;
  variant<winmd::reader::ElemSig,_std::vector<winmd::reader::ElemSig,_std::allocator<winmd::reader::ElemSig>_>_>
  *__v;
  variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
  *variant;
  FixedArgSig *signature_00;
  anon_class_1_0_00000001 local_69;
  anon_class_8_1_6971b95b local_68;
  anon_class_8_1_6971b95b local_60 [3];
  vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_> *local_48;
  vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_> *args;
  CustomAttributeSig signature;
  CustomAttribute *attribute_local;
  
  signature.m_named_args.
  super__Vector_base<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)attribute;
  winmd::reader::CustomAttribute::Value((CustomAttributeSig *)&args,attribute);
  local_48 = winmd::reader::CustomAttributeSig::FixedArgs((CustomAttributeSig *)&args);
  sVar2 = std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::size
                    (local_48);
  if (sVar2 == 2) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&__return_storage_ptr__->name);
    __return_storage_ptr__->version = 0;
    signature_00 = (FixedArgSig *)0x1;
    this = (cppwinrt *)
           std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
           operator[](local_48,1);
    uVar1 = get_integer_attribute<unsigned_int>(this,signature_00);
    __return_storage_ptr__->version = uVar1;
    __v = &std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::
           operator[](local_48,0)->value;
    variant = &::std::
               get<winmd::reader::ElemSig,winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                         (__v)->value;
    local_68.result = __return_storage_ptr__;
    local_60[0].result = __return_storage_ptr__;
    call<std::variant<bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>const&,cppwinrt::decode_contract_version_attribute(winmd::reader::CustomAttribute_const&)::__1,cppwinrt::decode_contract_version_attribute(winmd::reader::CustomAttribute_const&)::__2,cppwinrt::decode_contract_version_attribute(winmd::reader::CustomAttribute_const&)::__0>
              (variant,local_60,&local_68,&local_69);
    winmd::reader::CustomAttributeSig::~CustomAttributeSig((CustomAttributeSig *)&args);
    return __return_storage_ptr__;
  }
  __assert_fail("args.size() == 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/oldnewthing[P]cppwinrt/cppwinrt/helpers.h"
                ,0x167,
                "contract_version cppwinrt::decode_contract_version_attribute(const CustomAttribute &)"
               );
}

Assistant:

static contract_version decode_contract_version_attribute(CustomAttribute const& attribute)
    {
        // ContractVersionAttribute has three constructors, but only two we care about here:
        //      .ctor(string contract, uint32 version)
        //      .ctor(System.Type contract, uint32 version)
        auto signature = attribute.Value();
        auto& args = signature.FixedArgs();
        assert(args.size() == 2);

        contract_version result{};
        result.version = get_integer_attribute<uint32_t>(args[1]);
        call(std::get<ElemSig>(args[0].value).value,
            [&](ElemSig::SystemType t)
            {
                result.name = t.name;
            },
            [&](std::string_view name)
            {
                result.name = name;
            },
            [](auto&&)
            {
                assert(false);
            });

        return result;
    }